

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O3

bool __thiscall GF2::WW<127UL>::Next(WW<127UL> *this,bool saveWeight)

{
  byte *pbVar1;
  word *pwVar2;
  bool bVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  undefined7 in_register_00000031;
  ulong uVar11;
  ulong uVar12;
  size_t pos2;
  ulong uVar13;
  
  if ((int)CONCAT71(in_register_00000031,saveWeight) == 0) {
    lVar7 = 0;
    bVar5 = true;
    do {
      bVar3 = bVar5;
      pwVar2 = this->_words + lVar7;
      *pwVar2 = *pwVar2 + 1;
      if (*pwVar2 != 0) {
        if (!bVar3) {
          pbVar1 = (byte *)((long)this->_words + 0xf);
          *pbVar1 = *pbVar1 & 0x7f;
          return this->_words[lVar7] != 0;
        }
        return true;
      }
      lVar7 = 1;
      bVar5 = false;
    } while (bVar3);
    return false;
  }
  uVar6 = 0;
  while ((this->_words[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0) {
    uVar6 = uVar6 + 1;
    if (uVar6 == 0x7f) {
      return false;
    }
  }
  if (uVar6 == 0x7f) {
    return false;
  }
  uVar13 = 0x7e;
  if (0x7e < uVar6) {
    uVar13 = uVar6;
  }
  pos2 = uVar13 + 1;
  uVar13 = uVar6 - 1;
  uVar4 = uVar6;
  do {
    uVar11 = uVar4;
    uVar9 = uVar13;
    if (0x7d < uVar9 + 1) {
      if (pos2 == 0x7f) {
        Set(this,0,0x7f - uVar6,true);
        Set(this,0x7f - uVar6,0x7f,false);
        return false;
      }
      bVar8 = (byte)pos2;
      uVar12 = pos2 >> 6;
      goto LAB_001216da;
    }
    uVar10 = uVar9 + 2;
    uVar12 = uVar10 >> 6;
    bVar8 = (byte)uVar10;
    uVar13 = uVar9 + 1;
    uVar4 = uVar11 + 1;
  } while ((this->_words[uVar12] >> (uVar10 & 0x3f) & 1) != 0);
  pos2 = uVar9 + 2;
LAB_001216da:
  uVar13 = 0x7e;
  if (uVar11 < 0x7e) {
    uVar13 = uVar11;
  }
  Set(this,0,uVar13 - uVar6,true);
  Set(this,uVar13 - uVar6,pos2,false);
  this->_words[uVar12] = this->_words[uVar12] | 1L << (bVar8 & 0x3f);
  return true;
}

Assistant:

bool Next(bool saveWeight = false)
	{	
		size_t pos = 0;
		if (!saveWeight)
		{
			// инкремент слова-как-числа
			for (; pos < _wcount && ++_words[pos] == 0; ++pos);
			// перенос не попал в последнее слово представления?
			if (pos + 1 < _wcount) 
				return true;
			// прошли последнее слово?
			if (pos == _wcount) 
				return false;
			// остановились в последнем слове
			Trim(); 
			return _words[pos] != 0;
		}
		// ищем начало серии из единиц
		for (; pos < _n && !Test(pos); ++pos);
		// единиц нет?
		if (pos == _n) 
			return false;
		// ищем окончание серии
		size_t end = pos + 1;
		for (; end < _n && Test(end); ++end);
		// серия справа?
		if (end == _n)
		{
			// возвращаемся к первому слову с данным весом
			First(end - pos);
			return false;
		}
		// разрываем серию
		Set(0, end - pos - 1, 1); 
		Set(end - pos - 1, end, 0);
		Set(end, 1);
		return true;
	}